

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.h
# Opt level: O2

void __thiscall cmXMLElement::cmXMLElement(cmXMLElement *this,cmXMLWriter *xml,char *tag)

{
  allocator<char> local_31;
  string local_30;
  
  this->xmlwr = xml;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,tag,&local_31);
  cmXMLWriter::StartElement(xml,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

cmXMLElement(cmXMLWriter& xml, const char* tag)
    : xmlwr(xml)
  {
    this->xmlwr.StartElement(tag);
  }